

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function_simd.cpp
# Opt level: O3

void simd::Threshold(Image *in,uint32_t startXIn,uint32_t startYIn,Image *out,uint32_t startXOut,
                    uint32_t startYOut,uint32_t width,uint32_t height,uint8_t minThreshold,
                    uint8_t maxThreshold,SIMDType simdType)

{
  uint8_t *outYEnd;
  uint8_t *puVar1;
  byte bVar2;
  uint rowSizeIn;
  uint rowSizeOut;
  ulong uVar3;
  ulong uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  uint8_t minThreshold_00;
  uint8_t maxThreshold_00;
  SIMDType SVar11;
  uint32_t simdWidth;
  SIMDType SVar12;
  uint uVar13;
  uint8_t *outY;
  EVP_PKEY_CTX *src;
  EVP_PKEY_CTX *src_00;
  uint8_t *inY;
  byte *pbVar14;
  uint totalSimdWidth;
  uint8_t *puVar15;
  long lVar16;
  undefined1 auVar17 [16];
  ImageTemplate<unsigned_char> local_80;
  ImageTemplate<unsigned_char> local_58;
  
  maxThreshold_00 = maxThreshold;
  minThreshold_00 = minThreshold;
  SVar11 = simdType;
  do {
    SVar12 = SVar11;
    if (SVar12 != avx_function) {
      if (SVar12 - sse_function < 2) {
        uVar13 = 0x10;
        if (0xf < width) goto LAB_001153e5;
      }
      else {
        uVar13 = 0;
        if (SVar12 != cpu_function) goto LAB_001153e5;
      }
      Image_Function::Threshold
                (in,startXIn,startYIn,out,startXOut,startYOut,width,height,minThreshold,maxThreshold
                );
      return;
    }
    SVar11 = sse_function;
  } while (width < 0x20);
  uVar13 = 0x20;
LAB_001153e5:
  Image_Function::ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
            (in,startXIn,startYIn,out,startXOut,startYOut,width,height);
  local_80._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00132ba8;
  local_80._data = (uchar *)0x0;
  local_80._type = out->_type;
  PenguinV_Image::ImageTemplate<unsigned_char>::copy(&local_80,(EVP_PKEY_CTX *)out,src);
  Image_Function::VerifyGrayScaleImage<PenguinV_Image::ImageTemplate<unsigned_char>>(in);
  Image_Function::VerifyGrayScaleImage<PenguinV_Image::ImageTemplate<unsigned_char>>(&local_80);
  local_80._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00132ba8;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_80);
  local_58._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00132ba8;
  local_58._data = (uchar *)0x0;
  local_58._type = out->_type;
  PenguinV_Image::ImageTemplate<unsigned_char>::copy(&local_58,(EVP_PKEY_CTX *)out,src_00);
  Image_Function::
  OptimiseRoi<PenguinV_Image::ImageTemplate<unsigned_char>,PenguinV_Image::ImageTemplate<unsigned_char>>
            (&width,&height,in,&local_58);
  local_58._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00132ba8;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_58);
  rowSizeIn = in->_rowSize;
  rowSizeOut = out->_rowSize;
  uVar3 = (ulong)width / (ulong)uVar13;
  uVar4 = (ulong)width % (ulong)uVar13;
  simdWidth = (uint32_t)uVar3;
  totalSimdWidth = simdWidth * uVar13;
  inY = in->_data + (ulong)startXIn + (ulong)(startYIn * rowSizeIn);
  outY = out->_data + (ulong)startXOut + (ulong)(startYOut * rowSizeOut);
  outYEnd = outY + height * rowSizeOut;
  if (SVar12 == sse_function) {
    if (height * rowSizeOut != 0) {
      auVar17[8] = 0x80;
      auVar17._0_8_ = 0x8080808080808080;
      auVar17[9] = 0x80;
      auVar17[10] = 0x80;
      auVar17[0xb] = 0x80;
      auVar17[0xc] = 0x80;
      auVar17[0xd] = 0x80;
      auVar17[0xe] = 0x80;
      auVar17[0xf] = 0x80;
      auVar6 = vpbroadcastb_avx512vl();
      auVar7 = vpbroadcastb_avx512vl();
      do {
        if (uVar13 <= width) {
          lVar16 = 0;
          do {
            lVar10 = lVar16 + 0x10;
            auVar5 = auVar17 ^ *(undefined1 (*) [16])(inY + lVar10 + -0x10);
            uVar8 = vpcmpb_avx512vl(auVar6,auVar5,2);
            uVar9 = vpcmpb_avx512vl(auVar5,auVar7,2);
            auVar5 = vpmovm2b_avx512vl(uVar8 & uVar9);
            *(undefined1 (*) [16])(outY + lVar16) = auVar5;
            lVar16 = lVar16 + 0x10;
          } while (inY + lVar10 != inY + uVar3 * 0x10);
        }
        if (width != totalSimdWidth) {
          puVar15 = outY + totalSimdWidth;
          pbVar14 = inY + totalSimdWidth;
          puVar1 = puVar15 + uVar4;
          do {
            bVar2 = *pbVar14;
            pbVar14 = pbVar14 + 1;
            *puVar15 = -(bVar2 <= maxThreshold_00 && minThreshold_00 <= bVar2);
            puVar15 = puVar15 + 1;
          } while (puVar15 != puVar1);
        }
        outY = outY + rowSizeOut;
        inY = inY + rowSizeIn;
      } while (outY != outYEnd);
    }
  }
  else if (SVar12 == avx_function) {
    avx::Threshold(rowSizeIn,rowSizeOut,inY,outY,outYEnd,minThreshold_00,maxThreshold_00,simdWidth,
                   totalSimdWidth,(uint32_t)uVar4);
  }
  return;
}

Assistant:

void Threshold( const Image & in, uint32_t startXIn, uint32_t startYIn, Image & out, uint32_t startXOut, uint32_t startYOut,
                    uint32_t width, uint32_t height, uint8_t minThreshold, uint8_t maxThreshold, SIMDType simdType )
    {
        const uint32_t simdSize = getSimdSize( simdType );

        if( (simdType == cpu_function) || (width < simdSize) ) {
            AVX_CODE( Threshold( in, startXIn, startYIn, out, startXOut, startYOut, width, height, minThreshold, maxThreshold, sse_function ); )

            Image_Function::Threshold( in, startXIn, startYIn, out, startXOut, startYOut, width, height, minThreshold, maxThreshold );
            return;
        }

        Image_Function::ParameterValidation( in, startXIn, startYIn, out, startXOut, startYOut, width, height );
        Image_Function::VerifyGrayScaleImage( in, out );

        Image_Function::OptimiseRoi( width, height, in, out );

        const uint32_t rowSizeIn  = in.rowSize();
        const uint32_t rowSizeOut = out.rowSize();

        const uint8_t * inY  = in.data()  + startYIn  * rowSizeIn  + startXIn;
        uint8_t       * outY = out.data() + startYOut * rowSizeOut + startXOut;

        const uint8_t * outYEnd = outY + height * rowSizeOut;

        const uint32_t simdWidth = width / simdSize;
        const uint32_t totalSimdWidth = simdWidth * simdSize;
        const uint32_t nonSimdWidth = width - totalSimdWidth;

        AVX_CODE( avx::Threshold( rowSizeIn, rowSizeOut, inY, outY, outYEnd, minThreshold, maxThreshold, simdWidth, totalSimdWidth, nonSimdWidth ); )
        SSE_CODE( sse::Threshold( rowSizeIn, rowSizeOut, inY, outY, outYEnd, minThreshold, maxThreshold, simdWidth, totalSimdWidth, nonSimdWidth ); )
        NEON_CODE( neon::Threshold( rowSizeIn, rowSizeOut, inY, outY, outYEnd, minThreshold, maxThreshold, simdWidth, totalSimdWidth, nonSimdWidth ); )
    }